

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void luaD_reallocCI(lua_State *L,int newsize)

{
  CallInfo *pCVar1;
  CallInfo *local_28;
  CallInfo *oldci;
  int newsize_local;
  lua_State *L_local;
  
  pCVar1 = L->base_ci;
  if ((ulong)(long)(newsize + 1) < 0x666666666666667) {
    local_28 = (CallInfo *)luaM_realloc_(L,L->base_ci,(long)L->size_ci * 0x28,(long)newsize * 0x28);
  }
  else {
    local_28 = (CallInfo *)luaM_toobig(L);
  }
  L->base_ci = local_28;
  L->size_ci = newsize;
  L->ci = L->base_ci + ((long)L->ci - (long)pCVar1) / 0x28;
  L->end_ci = L->base_ci + (long)L->size_ci + -1;
  return;
}

Assistant:

static void luaD_reallocCI(lua_State*L,int newsize){
CallInfo*oldci=L->base_ci;
luaM_reallocvector(L,L->base_ci,L->size_ci,newsize,CallInfo);
L->size_ci=newsize;
L->ci=(L->ci-oldci)+L->base_ci;
L->end_ci=L->base_ci+L->size_ci-1;
}